

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderCreateInfoWrapper::ShaderCreateInfoWrapper
          (ShaderCreateInfoWrapper *this,ShaderCreateInfoWrapper *rhs)

{
  _Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> _Var1;
  uint3 uStack_23;
  
  memcpy(this,rhs,0x98);
  _Var1._M_head_impl.m_Allocator =
       (rhs->m_pRawMemory)._M_t.
       super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
       super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
       super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
       super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
       _M_head_impl;
  (this->m_SourceFactory).m_pObject = (rhs->m_SourceFactory).m_pObject;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = _Var1._M_head_impl.m_Allocator;
  (rhs->m_SourceFactory).m_pObject = (IShaderSourceInputStreamFactory *)0x0;
  (rhs->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl =
       (rhs->m_pRawMemory)._M_t.
       super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
       super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
       super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (rhs->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  (rhs->m_CreateInfo).Source = (Char *)0x0;
  (rhs->m_CreateInfo).ByteCode = (void *)0x0;
  (rhs->m_CreateInfo).FilePath = (Char *)0x0;
  (rhs->m_CreateInfo).pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
  (rhs->m_CreateInfo).field_4.SourceLength = 0;
  (rhs->m_CreateInfo).EntryPoint = "main";
  (rhs->m_CreateInfo).Macros.Elements = (ShaderMacro *)0x0;
  (rhs->m_CreateInfo).Macros.Count = 0;
  (rhs->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = (Char *)0x0;
  (rhs->m_CreateInfo).Desc.ShaderType = SHADER_TYPE_UNKNOWN;
  (rhs->m_CreateInfo).Desc.UseCombinedTextureSamplers = false;
  (rhs->m_CreateInfo).Desc.CombinedSamplerSuffix = "_sampler";
  (rhs->m_CreateInfo).SourceLanguage = SHADER_SOURCE_LANGUAGE_DEFAULT;
  (rhs->m_CreateInfo).ShaderCompiler = SHADER_COMPILER_DEFAULT;
  (rhs->m_CreateInfo).HLSLVersion.Major = 0;
  (rhs->m_CreateInfo).HLSLVersion.Minor = 0;
  (rhs->m_CreateInfo).GLSLVersion.Major = 0;
  (rhs->m_CreateInfo).GLSLVersion.Minor = 0;
  (rhs->m_CreateInfo).GLESSLVersion.Major = 0;
  (rhs->m_CreateInfo).GLESSLVersion.Minor = 0;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).GLESSLVersion.Minor + 1) = 0;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).MSLVersion.Minor + 1) = 0;
  *(ulong *)&(rhs->m_CreateInfo).field_0x85 = (ulong)uStack_23;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).GLSLExtensions + 5) = 0;
  *(undefined4 *)((long)&(rhs->m_CreateInfo).WebGPUEmulatedArrayIndexSuffix + 4) = 0;
  return;
}

Assistant:

ShaderCreateInfoWrapper(ShaderCreateInfoWrapper&& rhs) noexcept :
        m_CreateInfo{rhs.m_CreateInfo},
        m_SourceFactory{std::move(rhs.m_SourceFactory)},
        m_pRawMemory{std::move(rhs.m_pRawMemory)}
    {
        rhs.m_CreateInfo = {};
    }